

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_map.cpp
# Opt level: O2

void __thiscall tst_qpromise_map::convertValues(tst_qpromise_map *this)

{
  QSharedData *pQVar1;
  QString *pQVar2;
  bool bVar3;
  PromiseData<QList<QString>_> *this_00;
  long lVar4;
  QPromiseReject<QList<QString>_> *in_R8;
  initializer_list<int> args;
  initializer_list<QString> args_00;
  PromiseResolver<QList<QString>_> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_128;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_120;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data> local_118;
  PromiseType p;
  QArrayDataPointer<QString> local_100;
  QArrayDataPointer<QString> local_e8;
  QArrayDataPointer<QString> local_c8;
  undefined1 local_b0 [24];
  QString local_98;
  QString local_80;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  function<void_(const_QtPromisePrivate::PromiseError_&)> local_48;
  int local_24 [3];
  
  local_24[0] = 0x2a;
  local_24[1] = 0x2b;
  local_24[2] = 0x2c;
  args._M_len = 3;
  args._M_array = local_24;
  QList<int>::QList((QList<int> *)&local_c8,args);
  QtPromise::resolve<QList<int>>((QtPromise *)&local_100,(QList<int> *)&local_c8);
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0014b060;
  this_00 = (PromiseData<QList<QString>_> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_error.m_data.
  _M_exception_object = (void *)0x0;
  (this_00->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.size
       = 0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.size
       = 0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_catchers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.d =
       (Data *)0x0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_lock = 0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).m_settled = 0;
  (this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
  _vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)
   &(this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
    super_QSharedData = 0;
  (this_00->m_value).m_data.super___shared_ptr<QList<QString>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<QList<QString>_>::PromiseData(this_00);
  LOCK();
  pQVar1 = &(this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
            super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseData<QList<QString>_> *)0x0) {
    LOCK();
    pQVar1 = &(this_00->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e8.d = (Data *)&PTR__QPromiseBase_0014b470;
  p.super_QPromiseBase<QList<QString>_>.m_d.d = this_00;
  local_e8.ptr = (QString *)this_00;
  QtPromisePrivate::PromiseResolver<QList<QString>_>::PromiseResolver
            (&resolver,(QPromise<QList<QString>_> *)&local_e8);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase
            ((QPromiseBase<QList<QString>_> *)&local_e8);
  pQVar2 = local_100.ptr;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>)
         (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_120.d = (Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_128.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_128 = resolver.m_d.d;
  }
  local_130.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_128.d != (Data *)0x0) {
    LOCK();
    ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_128.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_118 = resolver.m_d.d;
  local_b0._0_8_ = resolver.m_d.d;
  local_b0._8_8_ = local_128.d;
  local_68._M_unused._M_object = operator_new(0x18);
  *(undefined8 *)local_68._M_unused._0_8_ = local_b0._0_8_;
  if ((Data *)local_b0._0_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_b0._0_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_b0._0_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = local_b0._8_8_;
  if ((Data *)local_b0._8_8_ != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_b0._8_8_)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_b0._8_8_)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(code *)((long)local_68._M_unused._0_8_ + 0x10) = local_b0[0x10];
  pcStack_50 = std::
               _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_QList<int>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<QList<int>,QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::convertValues()::$_0>(tst_qpromise_map::convertValues()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1},QList<int>const&>
  ::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>(QtPromise::QPromise<QList<int>>::map<tst_qpromise_map::convertValues()::$_0>(tst_qpromise_map::convertValues()::$_0)::{lambda(QList<int>const&)#1}(QList<int>const&)#1}const&,QtPromise::QPromiseResolve<QList<QString>>const&,QtPromise::QPromiseReject<QList<QString>>const&)
  ::{lambda(QList<int>const&)#1}::~function((_lambda_QList<int>const___1_ *)local_b0);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addHandler
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pQVar2,
             (function<void_(const_QList<int>_&)> *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  pQVar2 = local_100.ptr;
  QtPromisePrivate::PromiseCatcher<QList<int>,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<QList<QString>>,QtPromise::QPromiseReject<QList<QString>>>
            (&local_48,(PromiseCatcher<QList<int>,decltype(nullptr),void> *)0x0,&local_118,
             (QPromiseResolve<QList<QString>_> *)&local_128,in_R8);
  QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::addCatcher
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)pQVar2,&local_48);
  std::_Function_base::~_Function_base(&local_48.super__Function_base);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_130);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_118);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&local_120);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  p.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_0014b470;
  bVar3 = QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::isPending
                    ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_100.ptr);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::dispatch
              ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)local_100.ptr);
  }
  QtPromise::QPromiseBase<QList<int>_>::~QPromiseBase((QPromiseBase<QList<int>_> *)&local_100);
  QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)&local_c8);
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (QString *)0x0;
  local_e8.size = 0;
  waitForValue<QList<QString>>((QList<QString> *)&local_c8,&p,(QList<QString> *)&local_e8);
  QString::QString((QString *)local_b0,"43");
  QString::QString(&local_98,"44");
  QString::QString(&local_80,"45");
  args_00._M_len = 3;
  args_00._M_array = (iterator)local_b0;
  QList<QString>::QList((QList<QString> *)&local_100,args_00);
  QTest::qCompare<QString>
            ((QList<QString> *)&local_c8,(QList<QString> *)&local_100,
             "waitForValue(p, QVector<QString>{})","(QVector<QString>{\"43\", \"44\", \"45\"})",
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_map.cpp"
             ,0x58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_100);
  lVar4 = 0x30;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)(local_b0 + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
  QtPromise::QPromiseBase<QList<QString>_>::~QPromiseBase(&p.super_QPromiseBase<QList<QString>_>);
  return;
}

Assistant:

void tst_qpromise_map::convertValues()
{
    auto p = QtPromise::resolve(QVector<int>{42, 43, 44}).map([](int v, ...) {
        return QString::number(v + 1);
    });

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<QString>>>::value));
    QCOMPARE(waitForValue(p, QVector<QString>{}), (QVector<QString>{"43", "44", "45"}));
}